

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::ValidationContextImpl::addIdRef(ValidationContextImpl *this,XMLCh *content)

{
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *this_00;
  XMLCh *key;
  XMLRefInfo *local_20;
  XMLRefInfo *idEntry;
  XMLCh *content_local;
  ValidationContextImpl *this_local;
  
  if ((this->fIdRefList != (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)0x0
      ) && ((this->fToCheckIdRefList & 1U) != 0)) {
    local_20 = RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::get
                         (this->fIdRefList,content);
    if (local_20 == (XMLRefInfo *)0x0) {
      local_20 = (XMLRefInfo *)
                 XMemory::operator_new(0x20,(this->super_ValidationContext).fMemoryManager);
      XMLRefInfo::XMLRefInfo
                (local_20,content,false,false,(this->super_ValidationContext).fMemoryManager);
      this_00 = this->fIdRefList;
      key = XMLRefInfo::getRefName(local_20);
      RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put(this_00,key,local_20);
    }
    XMLRefInfo::setUsed(local_20,true);
  }
  return;
}

Assistant:

void ValidationContextImpl::addIdRef(const XMLCh * const content)
{
    if (!fIdRefList || !fToCheckIdRefList)
        return;

    XMLRefInfo* idEntry = fIdRefList->get(content);

    if (!idEntry)
    {
        idEntry = new (fMemoryManager) XMLRefInfo(content, false, false, fMemoryManager);
        fIdRefList->put((void*)idEntry->getRefName(), idEntry);
    }

    //
    //  Mark it used
    //
    idEntry->setUsed(true);

}